

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash.cpp
# Opt level: O1

uint64_t MurmurHash64B(void *key,int len,uint seed)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = seed ^ len;
  uVar3 = 0;
  if (7 < len) {
    uVar3 = 0;
    iVar5 = len;
    do {
      uVar4 = uVar4 * 0x5bd1e995 ^
              ((uint)(*key * 0x5bd1e995) >> 0x18 ^ *key * 0x5bd1e995) * 0x5bd1e995;
      pbVar1 = (byte *)((long)key + 4);
      key = (void *)((long)key + 8);
      uVar3 = uVar3 * 0x5bd1e995 ^
              ((uint)(*(int *)pbVar1 * 0x5bd1e995) >> 0x18 ^ *(int *)pbVar1 * 0x5bd1e995) *
              0x5bd1e995;
      len = iVar5 + -8;
      bVar2 = 0xf < iVar5;
      iVar5 = len;
    } while (bVar2);
  }
  if (3 < len) {
    iVar5 = *key;
    key = (void *)((long)key + 4);
    uVar4 = uVar4 * 0x5bd1e995 ^
            ((uint)(iVar5 * 0x5bd1e995) >> 0x18 ^ iVar5 * 0x5bd1e995) * 0x5bd1e995;
    len = len + -4;
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_0010b4db;
      uVar3 = uVar3 ^ (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar3 = uVar3 ^ (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar3 = (*key ^ uVar3) * 0x5bd1e995;
LAB_0010b4db:
  uVar4 = (uVar3 >> 0x12 ^ uVar4) * 0x5bd1e995;
  uVar3 = (uVar4 >> 0x16 ^ uVar3) * 0x5bd1e995;
  uVar4 = (uVar3 >> 0x11 ^ uVar4) * 0x5bd1e995;
  return CONCAT44(uVar4,(uVar4 >> 0x13 ^ uVar3) * 0x5bd1e995);
}

Assistant:

uint64_t MurmurHash64B(const void *key, int len, unsigned int seed) {
    const unsigned int m = 0x5bd1e995;
    const int r = 24;

    unsigned int h1 = seed ^len;
    unsigned int h2 = 0;

    const unsigned int *data = (const unsigned int *) key;

    while (len >= 8) {
        unsigned int k1 = *data++;
        k1 *= m;
        k1 ^= k1 >> r;
        k1 *= m;
        h1 *= m;
        h1 ^= k1;
        len -= 4;

        unsigned int k2 = *data++;
        k2 *= m;
        k2 ^= k2 >> r;
        k2 *= m;
        h2 *= m;
        h2 ^= k2;
        len -= 4;
    }

    if (len >= 4) {
        unsigned int k1 = *data++;
        k1 *= m;
        k1 ^= k1 >> r;
        k1 *= m;
        h1 *= m;
        h1 ^= k1;
        len -= 4;
    }

    switch (len) {
        case 3:
            h2 ^= ((unsigned char *) data)[2] << 16;
        case 2:
            h2 ^= ((unsigned char *) data)[1] << 8;
        case 1:
            h2 ^= ((unsigned char *) data)[0];
            h2 *= m;
    };

    h1 ^= h2 >> 18;
    h1 *= m;
    h2 ^= h1 >> 22;
    h2 *= m;
    h1 ^= h2 >> 17;
    h1 *= m;
    h2 ^= h1 >> 19;
    h2 *= m;

    uint64_t h = h1;

    h = (h << 32) | h2;

    return h;
}